

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorSet::FileDescriptorSet(FileDescriptorSet *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = arena;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorSet_003b9208;
  (this->file_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  if (scc_info_FileDescriptorSet_google_2fprotobuf_2fdescriptor_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    internal::InitSCCImpl(&scc_info_FileDescriptorSet_google_2fprotobuf_2fdescriptor_2eproto.base);
  }
  return;
}

Assistant:

FileDescriptorSet::FileDescriptorSet(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena),
  file_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.FileDescriptorSet)
}